

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

natwm_error
client_handle_fullscreen_window
          (natwm_state *state,xcb_ewmh_wm_state_action_t action,xcb_window_t window)

{
  natwm_error nVar1;
  client *client;
  
  client = workspace_list_find_window_client(state->workspace_list,window);
  if (client == (client *)0x0) {
    nVar1 = NOT_FOUND_ERROR;
  }
  else {
    if (action != XCB_EWMH_WM_STATE_REMOVE) {
      if (action != XCB_EWMH_WM_STATE_TOGGLE) {
        if (action != XCB_EWMH_WM_STATE_ADD) {
          return GENERIC_ERROR;
        }
LAB_001063df:
        nVar1 = client_set_fullscreen(state,client);
        return nVar1;
      }
      if (client->is_fullscreen != true) goto LAB_001063df;
    }
    client_unset_fullscreen(state,client);
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error client_handle_fullscreen_window(struct natwm_state *state,
                                                 xcb_ewmh_wm_state_action_t action,
                                                 xcb_window_t window)
{
        struct client *client = workspace_list_find_window_client(state->workspace_list, window);

        if (client == NULL) {
                return NOT_FOUND_ERROR;
        }

        switch (action) {
        case XCB_EWMH_WM_STATE_ADD:
                return client_set_fullscreen(state, client);
        case XCB_EWMH_WM_STATE_REMOVE:
                return client_unset_fullscreen(state, client);
        case XCB_EWMH_WM_STATE_TOGGLE:
                return (client->is_fullscreen) ? client_unset_fullscreen(state, client)
                                               : client_set_fullscreen(state, client);
        }

        return GENERIC_ERROR;
}